

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::captureValues<char[7]>(Capturer *this,size_t index,char (*value) [7])

{
  void *pvVar1;
  size_type in_RCX;
  char *pcVar2;
  StringRef string;
  string local_40;
  
  pvVar1 = memchr(value,0,7);
  pcVar2 = (char *)((long)pvVar1 - (long)value);
  if (pvVar1 == (void *)0x0) {
    pcVar2 = (char *)0x7;
  }
  string.m_size = in_RCX;
  string.m_start = pcVar2;
  Detail::convertIntoString_abi_cxx11_(&local_40,(Detail *)value,string);
  captureValue(this,index,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }